

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_79(QPDF *pdf,char *arg2)

{
  pointer *this;
  initializer_list<QPDFObjectHandle> __l;
  bool bVar1;
  int iVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_00;
  const_reference pvVar3;
  reference pQVar4;
  long lVar5;
  long lVar6;
  void *__s1;
  void *__s2;
  size_t __n;
  QPDFObjectHandle *local_510;
  QPDFWriter local_488 [8];
  QPDFWriter w;
  undefined1 local_478 [8];
  shared_ptr<Buffer> copy_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  QPDFObjectHandle local_428;
  allocator<char> local_411;
  string local_410 [32];
  QPDFObjectHandle local_3f0;
  undefined1 local_3e0 [8];
  QPDFObjectHandle copy;
  shared_ptr<Buffer> orig_data;
  string istr;
  QPDFObjectHandle orig;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  undefined1 local_370 [4];
  int i;
  allocator<char> local_359;
  string local_358 [32];
  QPDFObjectHandle local_338;
  allocator<QPDFObjectHandle> local_321;
  QPDFObjectHandle local_320;
  QPDFObjectHandle local_310;
  QPDFObjectHandle local_300;
  QPDFObjectHandle local_2f0;
  undefined1 local_2e0 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  undefined1 local_2b8 [8];
  QPDFObjectHandle s3;
  shared_ptr<Buffer> bp;
  Pl_Buffer b;
  allocator<char> local_259;
  string local_258 [32];
  QPDFObjectHandle local_238;
  allocator<char> local_221;
  string local_220 [32];
  QPDFObjectHandle local_200;
  allocator<char> local_1e9;
  string local_1e8 [32];
  QPDFObjectHandle local_1c8;
  QPDFObjectHandle local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  QPDFObjectHandle local_148;
  allocator<char> local_131;
  string local_130 [32];
  QPDFObjectHandle local_110;
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  QPDFObjectHandle s2;
  string local_c0 [32];
  undefined1 local_a0 [8];
  QPDFObjectHandle s1;
  value_type p1;
  QPDFObjectHandle null;
  string local_68 [48];
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle copies;
  char *arg2_local;
  QPDF *pdf_local;
  
  copies.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDFObjectHandle::newArray();
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"/Copies",
             (allocator<char> *)
             ((long)&null.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::replaceKey((string *)&local_38,(QPDFObjectHandle *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&null.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  QPDFObjectHandle::newNull();
  this_00 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this_00,0);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &s1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"/Contents",
             (allocator<char> *)
             ((long)&s2.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&s2.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"from string",&local_f9);
  QPDFObjectHandle::newStream((QPDF *)local_d8,(string *)pdf);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  QPDFObjectHandle::getDict();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"/Stuff",&local_131);
  QPDFObjectHandle::newInteger((longlong)&local_1c8);
  QPDF::makeIndirectObject((QPDFObjectHandle *)&local_1b8);
  QPDFObjectHandle::unparse_abi_cxx11_();
  std::operator+(&local_188,"<< /Direct 3 /Indirect ",&local_1a8);
  std::operator+(&local_168,&local_188,">>");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"",&local_1e9);
  QPDFObjectHandle::parse((QPDF *)&local_148,(string *)pdf,(string *)&local_168);
  QPDFObjectHandle::replaceKey((string *)&local_110,(QPDFObjectHandle *)local_130);
  QPDFObjectHandle::~QPDFObjectHandle(&local_148);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1c8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  QPDFObjectHandle::~QPDFObjectHandle(&local_110);
  QPDFObjectHandle::getDict();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"/Other",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"other stuff",&local_259);
  QPDFObjectHandle::newString((string *)&local_238);
  QPDFObjectHandle::replaceKey((string *)&local_200,(QPDFObjectHandle *)local_220);
  QPDFObjectHandle::~QPDFObjectHandle(&local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  QPDFObjectHandle::~QPDFObjectHandle(&local_200);
  Pl_Buffer::Pl_Buffer
            ((Pl_Buffer *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "buffer",(Pipeline *)0x0);
  Pipeline::writeCStr((char *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     );
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  this = &streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<Buffer>::shared_ptr
            ((shared_ptr<Buffer> *)this,
             (shared_ptr<Buffer> *)
             &s3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::newStream(local_2b8,pdf,this);
  std::shared_ptr<Buffer>::~shared_ptr
            ((shared_ptr<Buffer> *)
             &streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  QPDFObjectHandle::QPDFObjectHandle(&local_320,(QPDFObjectHandle *)local_a0);
  QPDFObjectHandle::QPDFObjectHandle(&local_310,(QPDFObjectHandle *)local_d8);
  QPDFObjectHandle::QPDFObjectHandle(&local_300,(QPDFObjectHandle *)local_2b8);
  local_2f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_2f0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_320;
  std::allocator<QPDFObjectHandle>::allocator(&local_321);
  __l._M_len = (size_type)
               local_2f0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_2f0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2e0,__l,&local_321
            );
  std::allocator<QPDFObjectHandle>::~allocator(&local_321);
  local_510 = &local_2f0;
  do {
    local_510 = local_510 + -1;
    QPDFObjectHandle::~QPDFObjectHandle(local_510);
  } while (local_510 != &local_320);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_358,"/Originals",&local_359);
  QPDFObjectHandle::newArray(local_370);
  QPDFObjectHandle::replaceKey((string *)&local_338,(QPDFObjectHandle *)local_358);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_370);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  QPDFObjectHandle::~QPDFObjectHandle(&local_338);
  __range1._4_4_ = 0;
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2e0);
  orig.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2e0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&orig.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) {
      QPDFWriter::QPDFWriter(local_488,pdf,"a.pdf");
      QPDFWriter::setStaticID(SUB81(local_488,0));
      QPDFWriter::setQDFMode(SUB81(local_488,0));
      QPDFWriter::write();
      QPDFWriter::~QPDFWriter(local_488);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_2e0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2b8);
      std::shared_ptr<Buffer>::~shared_ptr
                ((shared_ptr<Buffer> *)
                 &s3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      Pl_Buffer::~Pl_Buffer
                ((Pl_Buffer *)&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a0);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &s1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &p1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
      return;
    }
    pQVar4 = __gnu_cxx::
             __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)((long)&istr.field_2 + 8),pQVar4);
    __range1._4_4_ = __range1._4_4_ + 1;
    QUtil::int_to_string_abi_cxx11_
              ((longlong)
               &orig_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               __range1._4_4_);
    QPDFObjectHandle::getStreamData((int)&copy + 8);
    QPDFObjectHandle::copyStream();
    QPDFObjectHandle::getDict();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_410,"/Other",&local_411);
    std::operator+(&local_448,"other: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &orig_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::newString((string *)&local_428);
    QPDFObjectHandle::replaceKey((string *)&local_3f0,(QPDFObjectHandle *)local_410);
    QPDFObjectHandle::~QPDFObjectHandle(&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string(local_410);
    std::allocator<char>::~allocator(&local_411);
    QPDFObjectHandle::~QPDFObjectHandle(&local_3f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &copy_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   "something new ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &orig_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::replaceStreamData
              ((string *)(istr.field_2._M_local_buf + 8),
               (QPDFObjectHandle *)
               &copy_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (QPDFObjectHandle *)
               &p1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &copy_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_478);
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    lVar5 = Buffer::getSize();
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_478);
    lVar6 = Buffer::getSize();
    if (lVar5 != lVar6) break;
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    __s1 = (void *)Buffer::getBuffer();
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_478);
    __s2 = (void *)Buffer::getBuffer();
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    __n = Buffer::getSize();
    iVar2 = memcmp(__s1,__s2,__n);
    if (iVar2 != 0) {
      __assert_fail("memcmp(orig_data->getBuffer(), copy_data->getBuffer(), orig_data->getSize()) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xad1,"void test_79(QPDF &, const char *)");
    }
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_28);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_478);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3e0);
    std::shared_ptr<Buffer>::~shared_ptr
              ((shared_ptr<Buffer> *)
               &copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &orig_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&istr.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("orig_data->getSize() == copy_data->getSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xad0,"void test_79(QPDF &, const char *)");
}

Assistant:

static void
test_79(QPDF& pdf, char const* arg2)
{
    // Exercise stream copier

    // Copy streams. Modify the original and make sure the copy is
    // unaffected.
    auto copies = QPDFObjectHandle::newArray();
    pdf.getTrailer().replaceKey("/Copies", copies);
    auto null = QPDFObjectHandle::newNull();

    // Get a regular stream from the file
    auto p1 = pdf.getAllPages().at(0);
    auto s1 = p1.getKey("/Contents");

    // Create a stream from a string
    auto s2 = QPDFObjectHandle::newStream(&pdf, "from string");
    // Add direct and indirect objects to the dictionary
    s2.getDict().replaceKey(
        "/Stuff",
        QPDFObjectHandle::parse(
            &pdf,
            "<< /Direct 3 /Indirect " +
                pdf.makeIndirectObject(QPDFObjectHandle::newInteger(16059)).unparse() + ">>"));
    s2.getDict().replaceKey("/Other", QPDFObjectHandle::newString("other stuff"));

    // Use a provider
    Pl_Buffer b("buffer");
    b.writeCStr("from buffer");
    b.finish();
    auto bp = b.getBufferSharedPointer();
    auto s3 = QPDFObjectHandle::newStream(&pdf, bp);

    std::vector<QPDFObjectHandle> streams = {s1, s2, s3};
    pdf.getTrailer().replaceKey("/Originals", QPDFObjectHandle::newArray(streams));

    int i = 0;
    for (auto orig: streams) {
        ++i;
        auto istr = QUtil::int_to_string(i);
        auto orig_data = orig.getStreamData();
        auto copy = orig.copyStream();
        copy.getDict().replaceKey("/Other", QPDFObjectHandle::newString("other: " + istr));
        orig.replaceStreamData("something new " + istr, null, null);
        auto copy_data = copy.getStreamData();
        assert(orig_data->getSize() == copy_data->getSize());
        assert(memcmp(orig_data->getBuffer(), copy_data->getBuffer(), orig_data->getSize()) == 0);
        copies.appendItem(copy);
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}